

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  int *piVar9;
  void *pvVar10;
  long lVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Mat *pMVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  float *pfVar22;
  float *pfVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  void *pvVar27;
  float *pfVar28;
  uint uVar29;
  float *pfVar30;
  ulong uVar31;
  ulong uVar32;
  void *pvVar33;
  float *pfVar34;
  long lVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  int iVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  int iVar43;
  int iVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  void *local_188;
  ulong local_140;
  Mat local_f8;
  Option *local_a8;
  float *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Mat *local_70;
  long local_68;
  void *local_60;
  long local_58;
  void *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  iVar2 = bottom_blob->w;
  sVar8 = bottom_blob->elemsize;
  iVar24 = this->kernel_w;
  iVar3 = this->output_pad_right;
  iVar4 = this->dilation_w;
  iVar5 = this->stride_w;
  local_f8.cstep = 0;
  local_f8.data = (float *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  lVar35 = 0x10;
  if ((((this->pad_left < 1) && (this->pad_right < 1)) && (this->output_w < 1)) &&
     (lVar35 = 8, &local_f8 != top_blob)) {
    piVar9 = top_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    local_f8.data = top_blob->data;
    local_f8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_f8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_f8.elemsize = top_blob->elemsize;
    local_f8.elempack = top_blob->elempack;
    local_f8.allocator = top_blob->allocator;
    uVar13 = top_blob->dims;
    uVar14 = top_blob->w;
    uVar15 = top_blob->h;
    uVar16 = top_blob->d;
    local_f8.c = top_blob->c;
    local_f8.cstep = top_blob->cstep;
    local_f8.dims = uVar13;
    local_f8.w = uVar14;
    local_f8.h = uVar15;
    local_f8.d = uVar16;
  }
  local_a8 = opt;
  Mat::create(&local_f8,iVar3 + (iVar24 + -1) * iVar4 + (iVar2 + -1) * iVar5 + 1,this->num_output,
              sVar8,*(Allocator **)(&opt->lightmode + lVar35));
  iVar2 = local_f8.w;
  iVar24 = -100;
  if (((float *)local_f8.data != (float *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
    uVar6 = this->kernel_w;
    uVar7 = this->group;
    pvVar10 = (this->bias_data).data;
    if (pvVar10 == (void *)0x0) {
      bVar36 = true;
    }
    else {
      bVar36 = (long)(this->bias_data).c * (this->bias_data).cstep == 0;
    }
    iVar24 = bottom_blob->w;
    lVar35 = (long)iVar24;
    iVar3 = this->stride_w;
    iVar4 = this->dilation_w;
    iVar5 = this->activation_type;
    local_70 = top_blob;
    if (local_f8.h == uVar7 && bottom_blob->h == uVar7) {
      if (0 < (int)uVar7) {
        pvVar27 = bottom_blob->data;
        sVar8 = bottom_blob->elemsize;
        pvVar33 = (this->weight_data).data;
        uVar26 = (ulong)(uint)local_f8.w;
        uVar29 = local_f8.w + 3;
        lVar21 = uVar26 - 1;
        auVar44._8_4_ = (int)lVar21;
        auVar44._0_8_ = lVar21;
        auVar44._12_4_ = (int)((ulong)lVar21 >> 0x20);
        pfVar34 = (float *)((long)local_f8.data + 0xc);
        local_98._0_8_ = local_f8.elemsize * (long)local_f8.w;
        local_88._0_8_ = (long)(int)uVar6 << 2;
        uVar31 = 0;
        auVar44 = auVar44 ^ _DAT_00516150;
        pfVar23 = (float *)local_f8.data;
        auVar45 = _DAT_00516250;
        auVar47 = _DAT_00516260;
        auVar48 = _DAT_00516150;
        do {
          fVar38 = 0.0;
          if (!bVar36) {
            fVar38 = *(float *)((long)pvVar10 + uVar31 * 4);
          }
          if (0 < iVar2) {
            uVar19 = 0;
            do {
              auVar40._8_4_ = (int)uVar19;
              auVar40._0_8_ = uVar19;
              auVar40._12_4_ = (int)(uVar19 >> 0x20);
              auVar39 = (auVar40 | auVar47) ^ auVar48;
              iVar20 = auVar44._0_4_;
              bVar12 = iVar20 < auVar39._0_4_;
              iVar18 = auVar39._4_4_;
              iVar41 = auVar44._4_4_;
              if ((bool)(~(iVar41 < iVar18 || iVar18 == iVar41 && bVar12) & 1)) {
                pfVar34[uVar19 - 3] = fVar38;
              }
              if (iVar41 >= iVar18 && (iVar18 != iVar41 || !bVar12)) {
                pfVar34[uVar19 - 2] = fVar38;
              }
              auVar39 = (auVar40 | auVar45) ^ auVar48;
              iVar18 = auVar39._4_4_;
              if (iVar18 <= iVar41 && (iVar18 != iVar41 || auVar39._0_4_ <= iVar20)) {
                pfVar34[uVar19 - 1] = fVar38;
                pfVar34[uVar19] = fVar38;
              }
              uVar19 = uVar19 + 4;
            } while ((uVar29 & 0xfffffffc) != uVar19);
          }
          if (0 < iVar24) {
            lVar21 = 0;
            pfVar28 = pfVar23;
            do {
              if (0 < (int)uVar6) {
                fVar38 = *(float *)((long)pvVar27 + lVar21 * 4 + sVar8 * lVar35 * uVar31);
                uVar19 = 0;
                pfVar22 = pfVar28;
                do {
                  *pfVar22 = *(float *)((long)pvVar33 + uVar19 * 4) * fVar38 + *pfVar22;
                  uVar19 = uVar19 + 1;
                  pfVar22 = pfVar22 + iVar4;
                } while (uVar6 != uVar19);
              }
              lVar21 = lVar21 + 1;
              pfVar28 = pfVar28 + iVar3;
            } while (lVar21 != lVar35);
          }
          if (0 < iVar2) {
            pfVar28 = (float *)(this->activation_params).data;
            uVar19 = 0;
            do {
              fVar38 = pfVar23[uVar19];
              fVar37 = fVar38;
              switch(iVar5) {
              case 1:
                if (fVar38 <= 0.0) {
                  fVar37 = 0.0;
                }
                break;
              case 2:
                fVar37 = (float)(~-(uint)(0.0 < fVar38) & (uint)*pfVar28 |
                                -(uint)(0.0 < fVar38) & 0x3f800000) * fVar38;
                break;
              case 3:
                if (fVar38 <= *pfVar28) {
                  fVar38 = *pfVar28;
                }
                fVar37 = pfVar28[1];
                if (fVar38 <= pfVar28[1]) {
                  fVar37 = fVar38;
                }
                break;
              case 4:
                if (88.37626 <= fVar38) {
                  fVar38 = 88.37626;
                }
                fVar38 = expf((float)(-(uint)(fVar38 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar38 < -88.37626) & ((uint)fVar38 ^ auVar48._0_4_)))
                ;
                auVar45 = _DAT_00516250;
                auVar47 = _DAT_00516260;
                auVar48 = _DAT_00516150;
                fVar37 = 1.0 / (fVar38 + 1.0);
                break;
              case 5:
                fVar37 = expf(fVar38);
                fVar37 = logf(fVar37 + 1.0);
                fVar37 = tanhf(fVar37);
                auVar45 = _DAT_00516250;
                auVar47 = _DAT_00516260;
                auVar48 = _DAT_00516150;
                fVar37 = fVar37 * fVar38;
                break;
              case 6:
                fVar1 = *pfVar28;
                fVar42 = (float)((uint)pfVar28[1] ^ auVar48._0_4_) / fVar1;
                fVar37 = 0.0;
                if ((fVar42 <= fVar38) && (fVar37 = fVar38, fVar38 <= fVar42 + 1.0 / fVar1)) {
                  fVar37 = (fVar1 * fVar38 + pfVar28[1]) * fVar38;
                }
              }
              pfVar23[uVar19] = fVar37;
              uVar19 = uVar19 + 1;
            } while (uVar26 != uVar19);
          }
          uVar31 = uVar31 + 1;
          pfVar34 = (float *)((long)pfVar34 + local_98._0_8_);
          pfVar23 = (float *)((long)pfVar23 + local_98._0_8_);
          pvVar33 = (void *)((long)pvVar33 + local_88._0_8_);
        } while (uVar31 != uVar7);
      }
    }
    else {
      uVar29 = bottom_blob->h / (int)uVar7;
      if (0 < (int)uVar7) {
        uVar26 = (ulong)(uint)local_f8.w;
        lVar11 = (long)local_f8.h;
        local_60 = (this->weight_data).data;
        iVar20 = (int)(lVar11 / (long)(int)uVar7);
        local_68 = (long)iVar20;
        local_40 = (ulong)(local_f8.w + 3U & 0xfffffffc);
        lVar21 = uVar26 - 1;
        auVar45._8_4_ = (int)lVar21;
        auVar45._0_8_ = lVar21;
        auVar45._12_4_ = (int)((ulong)lVar21 >> 0x20);
        lVar21 = (long)local_f8.w * local_f8.elemsize;
        local_a0 = (float *)((long)local_f8.data + 0xc);
        local_58 = lVar21 * local_68;
        local_38 = (long)(int)(uVar29 * uVar6) << 2;
        iVar18 = 0;
        auVar45 = auVar45 ^ _DAT_00516150;
        local_140 = 0;
        pfVar34 = (float *)local_f8.data;
        auVar47 = _DAT_00516250;
        auVar48 = _DAT_00516260;
        auVar44 = _DAT_00516150;
        local_98 = auVar45;
        do {
          if (0 < iVar20) {
            local_188 = (void *)((long)local_60 + (long)iVar18 * 4);
            local_48 = local_140 * local_68;
            local_50 = (this->bias_data).data;
            uVar31 = 0;
            pfVar23 = pfVar34;
            pfVar28 = local_a0;
            do {
              fVar38 = 0.0;
              if (!bVar36) {
                fVar38 = *(float *)((long)local_50 + (local_48 + uVar31) * 4);
              }
              if (0 < iVar2) {
                uVar19 = 0;
                do {
                  auVar39._8_4_ = (int)uVar19;
                  auVar39._0_8_ = uVar19;
                  auVar39._12_4_ = (int)(uVar19 >> 0x20);
                  auVar40 = (auVar39 | auVar48) ^ auVar44;
                  iVar43 = auVar45._0_4_;
                  bVar12 = iVar43 < auVar40._0_4_;
                  iVar41 = auVar40._4_4_;
                  iVar46 = auVar45._4_4_;
                  if ((bool)(~(iVar46 < iVar41 || iVar41 == iVar46 && bVar12) & 1)) {
                    pfVar28[uVar19 - 3] = fVar38;
                  }
                  if (iVar46 >= iVar41 && (iVar41 != iVar46 || !bVar12)) {
                    pfVar28[uVar19 - 2] = fVar38;
                  }
                  auVar39 = (auVar39 | auVar47) ^ auVar44;
                  iVar41 = auVar39._4_4_;
                  if (iVar41 <= iVar46 && (iVar41 != iVar46 || auVar39._0_4_ <= iVar43)) {
                    pfVar28[uVar19 - 1] = fVar38;
                    pfVar28[uVar19] = fVar38;
                  }
                  uVar19 = uVar19 + 4;
                } while (local_40 != uVar19);
              }
              if (0 < iVar24) {
                pvVar10 = bottom_blob->data;
                iVar41 = bottom_blob->w;
                sVar8 = bottom_blob->elemsize;
                lVar25 = 0;
                pfVar22 = pfVar23;
                do {
                  if (0 < (int)uVar29) {
                    uVar19 = 0;
                    pvVar27 = local_188;
                    do {
                      if (0 < (int)uVar6) {
                        fVar38 = *(float *)((long)pvVar10 +
                                           (uVar19 + uVar29 * (int)local_140) * (long)iVar41 * sVar8
                                           + lVar25 * 4);
                        uVar32 = 0;
                        pfVar30 = pfVar22;
                        do {
                          *pfVar30 = *(float *)((long)pvVar27 + uVar32 * 4) * fVar38 + *pfVar30;
                          uVar32 = uVar32 + 1;
                          pfVar30 = pfVar30 + iVar4;
                        } while (uVar6 != uVar32);
                      }
                      uVar19 = uVar19 + 1;
                      pvVar27 = (void *)((long)pvVar27 + (long)(int)uVar6 * 4);
                    } while (uVar19 != uVar29);
                  }
                  lVar25 = lVar25 + 1;
                  pfVar22 = pfVar22 + iVar3;
                } while (lVar25 != lVar35);
              }
              if (0 < iVar2) {
                pfVar22 = (float *)(this->activation_params).data;
                uVar19 = 0;
                do {
                  fVar38 = pfVar23[uVar19];
                  fVar37 = fVar38;
                  switch(iVar5) {
                  case 1:
                    if (fVar38 <= 0.0) {
                      fVar37 = 0.0;
                    }
                    break;
                  case 2:
                    fVar37 = (float)(~-(uint)(0.0 < fVar38) & (uint)*pfVar22 |
                                    -(uint)(0.0 < fVar38) & 0x3f800000) * fVar38;
                    break;
                  case 3:
                    if (fVar38 <= *pfVar22) {
                      fVar38 = *pfVar22;
                    }
                    fVar37 = pfVar22[1];
                    if (fVar38 <= pfVar22[1]) {
                      fVar37 = fVar38;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar38) {
                      fVar38 = 88.37626;
                    }
                    fVar38 = expf((float)(-(uint)(fVar38 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar38 < -88.37626) &
                                         ((uint)fVar38 ^ auVar44._0_4_)));
                    auVar45 = local_98;
                    auVar47 = _DAT_00516250;
                    auVar48 = _DAT_00516260;
                    auVar44 = _DAT_00516150;
                    fVar37 = 1.0 / (fVar38 + 1.0);
                    break;
                  case 5:
                    local_88 = ZEXT416((uint)fVar38);
                    fVar38 = expf(fVar38);
                    fVar38 = logf(fVar38 + 1.0);
                    fVar38 = tanhf(fVar38);
                    auVar45 = local_98;
                    auVar47 = _DAT_00516250;
                    auVar48 = _DAT_00516260;
                    auVar44 = _DAT_00516150;
                    fVar37 = fVar38 * (float)local_88._0_4_;
                    break;
                  case 6:
                    fVar1 = *pfVar22;
                    fVar42 = (float)((uint)pfVar22[1] ^ auVar44._0_4_) / fVar1;
                    fVar37 = 0.0;
                    if ((fVar42 <= fVar38) && (fVar37 = fVar38, fVar38 <= fVar42 + 1.0 / fVar1)) {
                      fVar37 = (fVar1 * fVar38 + pfVar22[1]) * fVar38;
                    }
                  }
                  pfVar23[uVar19] = fVar37;
                  uVar19 = uVar19 + 1;
                } while (uVar26 != uVar19);
              }
              uVar31 = uVar31 + 1;
              pfVar28 = (float *)((long)pfVar28 + lVar21);
              pfVar23 = (float *)((long)pfVar23 + lVar21);
              local_188 = (void *)((long)local_188 + local_38);
            } while (uVar31 != (lVar11 / (long)(int)uVar7 & 0xffffffffU));
          }
          local_140 = local_140 + 1;
          local_a0 = (float *)((long)local_a0 + local_58);
          pfVar34 = (float *)((long)pfVar34 + local_58);
          iVar18 = iVar18 + iVar20 * uVar6 * uVar29;
        } while (local_140 != uVar7);
      }
    }
    pMVar17 = local_70;
    cut_padding(this,&local_f8,local_70,local_a8);
    if ((pMVar17->data == (void *)0x0) || (iVar24 = 0, (long)pMVar17->c * pMVar17->cstep == 0)) {
      iVar24 = -100;
    }
  }
  piVar9 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((float *)local_f8.data != (float *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}